

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactAngle2.cpp
# Opt level: O0

void __thiscall OpenMD::ContactAngle2::doFrame(ContactAngle2 *this,int param_2)

{
  undefined8 uVar1;
  double dVar2;
  bool bVar3;
  SnapshotManager *this_00;
  double *pdVar4;
  double *__b;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  long in_RDI;
  __type _Var11;
  __type _Var12;
  RealType RVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  RealType ca;
  RealType rDrop;
  RealType zCen;
  Vector<double,_2U> diff;
  RealType invLength;
  RealType length;
  Vector<double,_2U> diff_1;
  Vector<double,_2U> derLenAverage;
  RealType lenAverage;
  Vector<double,_2U> current;
  int i1;
  RealType radius;
  Vector<double,_2U> center;
  RealType coeff [3];
  RealType inv;
  DynamicVector<double,_std::allocator<double>_> evector;
  DynamicVector<double,_std::allocator<double>_> evals;
  DynamicRectMatrix<double> evects;
  Eigenvalue<double> eigensystem;
  RealType r4;
  RealType yr2;
  RealType xr2;
  RealType r2;
  RealType xy;
  RealType y2;
  RealType x2;
  RealType y;
  RealType x;
  int i_4;
  int col;
  int row;
  DynamicRectMatrix<double> mat;
  RealType invNumPoints;
  int i0;
  Vector<double,_2U> average;
  int numPoints;
  Vector<double,_2U> point;
  size_t i_3;
  int rloc;
  bool foundThresh;
  bool aboveThresh;
  RealType thez;
  uint j_1;
  vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_> points;
  uint j;
  RealType volSlice;
  RealType rU;
  RealType rL;
  uint i_2;
  int whichZBin;
  int whichRBin;
  RealType z;
  RealType r;
  Vector3d pos;
  Vector3d com;
  uint i_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  histo;
  RealType dz;
  RealType dr;
  RealType zLen;
  RealType len;
  Mat3x3d hmat;
  int i;
  StuntDouble *sd;
  Snapshot *in_stack_fffffffffffff998;
  Eigenvalue<double> *in_stack_fffffffffffff9a0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff9a8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff9b0;
  size_type in_stack_fffffffffffff9b8;
  double dVar17;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff9c0;
  SelectionEvaluator *in_stack_fffffffffffff9d8;
  undefined8 in_stack_fffffffffffff9e0;
  uint col_00;
  DynamicRectMatrix<double> *in_stack_fffffffffffff9e8;
  DynamicRectMatrix<double> *in_stack_fffffffffffffb18;
  Eigenvalue<double> *in_stack_fffffffffffffb20;
  Vector<double,_2U> local_3f8 [4];
  double local_3b8;
  SelectionManager *local_3b0;
  double local_398;
  Vector<double,_2U> local_390;
  double local_380;
  int local_364;
  double local_360;
  Vector<double,_2U> local_358;
  double local_348 [29];
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  int local_214;
  uint local_210;
  uint local_20c;
  DynamicRectMatrix<double> local_208;
  double local_1f8;
  int local_1ec;
  int local_1d4;
  Vector<double,_2U> local_1d0;
  ulong local_1c0;
  int local_1b8;
  byte local_1b2;
  byte local_1b1;
  DynamicRectMatrix<double> *local_1b0;
  uint local_1a4;
  vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_> local_1a0;
  uint local_184;
  double local_180;
  double local_178;
  double local_170;
  uint local_164;
  int local_160;
  int local_15c;
  double local_128;
  double local_120;
  Vector3<double> local_118;
  Vector3<double> local_100 [2];
  undefined8 local_d0;
  double *local_c8;
  double *local_c0;
  uint local_b4;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_b0;
  double local_98;
  double local_90;
  double local_88;
  double local_70;
  RectMatrix<double,_3U,_3U> local_68;
  StuntDouble *local_18;
  
  this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
  SnapshotManager::getCurrentSnapshot(this_00);
  Snapshot::getHmat(in_stack_fffffffffffff998);
  pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_68,0,0);
  __b = RectMatrix<double,_3U,_3U>::operator()(&local_68,1,1);
  pdVar4 = std::min<double>(pdVar4,__b);
  local_70 = *pdVar4;
  pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_68,2,2);
  local_88 = *pdVar4;
  uVar1 = *(undefined8 *)(in_RDI + 0xd70);
  auVar15._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar15._0_8_ = uVar1;
  auVar15._12_4_ = 0x45300000;
  local_90 = local_70 /
             ((auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  uVar1 = *(undefined8 *)(in_RDI + 0xd78);
  auVar16._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar16._0_8_ = uVar1;
  auVar16._12_4_ = 0x45300000;
  local_98 = local_88 /
             ((auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1322ed);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  for (local_b4 = 0; uVar5 = (ulong)local_b4,
      sVar6 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&local_b0), uVar5 < sVar6; local_b4 = local_b4 + 1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[](&local_b0,(ulong)local_b4);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[](&local_b0,(ulong)local_b4);
    local_c0 = (double *)
               std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff998);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[](&local_b0,(ulong)local_b4);
    local_c8 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff998);
    local_d0 = 0;
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
               (double *)in_stack_fffffffffffff9a0);
  }
  bVar3 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x120));
  if (bVar3) {
    SelectionEvaluator::evaluate(in_stack_fffffffffffff9d8);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffff9b0._M_current,
               (SelectionSet *)in_stack_fffffffffffff9a8._M_current);
    SelectionSet::~SelectionSet((SelectionSet *)0x1324b9);
  }
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffff9b0._M_current,
             (double)in_stack_fffffffffffff9a8._M_current,(double)in_stack_fffffffffffff9a0,
             (double)in_stack_fffffffffffff998);
  Vector3<double>::Vector3((Vector3<double> *)0x13251d);
  local_18 = SelectionManager::beginSelected
                       ((SelectionManager *)in_stack_fffffffffffff9b0._M_current,
                        (int *)in_stack_fffffffffffff9a8._M_current);
  while (local_18 != (StuntDouble *)0x0) {
    StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffff9a8._M_current);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff9a8._M_current,
                      (Vector<double,_3U> *)in_stack_fffffffffffff9a0);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffff9a8._M_current,
               (Vector<double,_3U> *)in_stack_fffffffffffff9a0);
    Vector3<double>::x(&local_118);
    _Var11 = std::pow<double,int>
                       ((double)in_stack_fffffffffffff9a0,
                        (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
    Vector3<double>::y(&local_118);
    _Var12 = std::pow<double,int>
                       ((double)in_stack_fffffffffffff9a0,
                        (int)((ulong)in_stack_fffffffffffff998 >> 0x20));
    local_120 = sqrt(_Var11 + _Var12);
    pdVar4 = Vector3<double>::z(&local_118);
    local_128 = *pdVar4;
    local_15c = (int)(local_120 / local_90);
    local_160 = (int)((local_88 / 2.0 + local_128) / local_98);
    if (((local_15c < (int)*(undefined8 *)(in_RDI + 0xd70)) && (-1 < local_160)) &&
       (local_160 < (int)*(undefined8 *)(in_RDI + 0xd78))) {
      RVar13 = StuntDouble::getMass(local_18);
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_b0,(long)local_15c);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)local_160);
      *pvVar8 = RVar13 + *pvVar8;
    }
    local_18 = SelectionManager::nextSelected
                         ((SelectionManager *)in_stack_fffffffffffff9b0._M_current,
                          (int *)in_stack_fffffffffffff9a8._M_current);
  }
  for (local_164 = 0; uVar5 = (ulong)local_164,
      sVar6 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&local_b0), uVar5 < sVar6; local_164 = local_164 + 1) {
    local_170 = (double)local_164 * local_90;
    local_178 = local_170 + local_90;
    local_180 = local_98 * 3.141592653589793 * (local_178 * local_178 + -(local_170 * local_170));
    local_184 = 0;
    while( true ) {
      uVar5 = (ulong)local_184;
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_b0,(ulong)local_164);
      sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar7);
      if (sVar6 <= uVar5) break;
      dVar14 = 1.66053886 / local_180;
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_b0,(ulong)local_164);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(ulong)local_184);
      *pvVar8 = dVar14 * *pvVar8;
      local_184 = local_184 + 1;
    }
  }
  std::vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::vector
            ((vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_> *)
             0x13292d);
  std::vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::clear
            ((vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_> *)
             0x13293a);
  for (local_1a4 = 0; (ulong)local_1a4 < *(ulong *)(in_RDI + 0xd78); local_1a4 = local_1a4 + 1) {
    pdVar4 = Vector3<double>::z(local_100);
    local_1b0 = (DynamicRectMatrix<double> *)
                (local_98 * ((double)local_1a4 + 0.5) +
                (*pdVar4 - *(double *)(in_RDI + 0xd48)) + local_88 * -0.5);
    local_1b1 = 0;
    local_1b2 = 0;
    local_1b8 = 0;
    for (local_1c0 = 0; local_1c0 < *(ulong *)(in_RDI + 0xd70); local_1c0 = local_1c0 + 1) {
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&local_b0,local_1c0);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(ulong)local_1a4);
      if (*(double *)(in_RDI + 0xd60) <= *pvVar8) {
        local_1b1 = 1;
      }
      if ((local_1b1 & 1) != 0) {
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_b0,local_1c0);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(ulong)local_1a4);
        if (*pvVar8 <= *(double *)(in_RDI + 0xd60)) {
          local_1b8 = (int)local_1c0;
          local_1b2 = 1;
          local_1b1 = 0;
        }
      }
    }
    if ((local_1b2 & 1) != 0) {
      Vector<double,_2U>::Vector(&local_1d0);
      dVar14 = local_90 * ((double)local_1b8 + 0.5);
      pdVar4 = Vector<double,_2U>::operator[](&local_1d0,0);
      *pdVar4 = dVar14;
      in_stack_fffffffffffffb18 = local_1b0;
      in_stack_fffffffffffffb20 = (Eigenvalue<double> *)Vector<double,_2U>::operator[](&local_1d0,1)
      ;
      *(DynamicRectMatrix<double> **)in_stack_fffffffffffffb20 = in_stack_fffffffffffffb18;
      if (*(double *)(in_RDI + 0xd68) <= (double)local_1b0 &&
          (double)local_1b0 != *(double *)(in_RDI + 0xd68)) {
        std::vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::
        push_back((vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                   *)in_stack_fffffffffffff9b0._M_current,
                  (value_type *)in_stack_fffffffffffff9a8._M_current);
      }
    }
  }
  sVar6 = std::vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::
          size(&local_1a0);
  local_1d4 = (int)sVar6;
  std::vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::operator[]
            (&local_1a0,0);
  Vector<double,_2U>::Vector
            ((Vector<double,_2U> *)in_stack_fffffffffffff9b0._M_current,
             (Vector<double,_2U> *)in_stack_fffffffffffff9a8._M_current);
  for (local_1ec = 1; local_1ec < local_1d4; local_1ec = local_1ec + 1) {
    std::vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::
    operator[](&local_1a0,(long)local_1ec);
    Vector<double,_2U>::operator+=
              ((Vector<double,_2U> *)in_stack_fffffffffffff9a0,
               (Vector<double,_2U> *)in_stack_fffffffffffff998);
  }
  local_1f8 = 1.0 / (double)local_1d4;
  Vector<double,_2U>::operator*=
            ((Vector<double,_2U> *)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
  DynamicRectMatrix<double>::DynamicRectMatrix
            ((DynamicRectMatrix<double> *)in_stack_fffffffffffff9b0._M_current,
             (uint)((ulong)in_stack_fffffffffffff9a8._M_current >> 0x20),
             (uint)in_stack_fffffffffffff9a8._M_current);
  for (local_20c = 0; (int)local_20c < 4; local_20c = local_20c + 1) {
    for (local_210 = 0; (int)local_210 < 4; local_210 = local_210 + 1) {
      pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,local_20c,local_210);
      *pdVar4 = 0.0;
    }
  }
  for (local_214 = 0; local_214 < local_1d4; local_214 = local_214 + 1) {
    pvVar9 = std::vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::
             operator[](&local_1a0,(long)local_214);
    pdVar4 = Vector<double,_2U>::operator[](pvVar9,0);
    local_220 = *pdVar4;
    pvVar9 = std::vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::
             operator[](&local_1a0,(long)local_214);
    pdVar4 = Vector<double,_2U>::operator[](pvVar9,1);
    dVar14 = local_220;
    local_228 = *pdVar4;
    local_230 = local_220 * local_220;
    local_238 = local_228 * local_228;
    local_240 = local_220 * local_228;
    local_248 = local_230 + local_238;
    local_250 = local_220 * local_248;
    local_258 = local_228 * local_248;
    local_260 = local_248 * local_248;
    pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,0,1);
    dVar2 = local_228;
    *pdVar4 = *pdVar4 + dVar14;
    pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,0,2);
    dVar14 = local_248;
    *pdVar4 = *pdVar4 + dVar2;
    pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,0,3);
    dVar17 = local_230;
    *pdVar4 = *pdVar4 + dVar14;
    pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,1,1);
    dVar2 = local_240;
    *pdVar4 = *pdVar4 + dVar17;
    pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,1,2);
    dVar14 = local_250;
    *pdVar4 = *pdVar4 + dVar2;
    pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,1,3);
    dVar17 = local_238;
    *pdVar4 = *pdVar4 + dVar14;
    pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,2,2);
    dVar2 = local_258;
    *pdVar4 = *pdVar4 + dVar17;
    pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,2,3);
    dVar14 = local_260;
    *pdVar4 = *pdVar4 + dVar2;
    pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,3,3);
    *pdVar4 = dVar14 + *pdVar4;
  }
  dVar14 = (double)local_1d4;
  pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,0,0);
  *pdVar4 = dVar14;
  for (local_20c = 0; (int)local_20c < 4; local_20c = local_20c + 1) {
    for (local_210 = 0; (int)local_210 < (int)local_20c; local_210 = local_210 + 1) {
      pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,local_210,local_20c);
      dVar14 = *pdVar4;
      pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,local_20c,local_210);
      *pdVar4 = dVar14;
    }
  }
  for (local_20c = 0; col_00 = (uint)((ulong)in_stack_fffffffffffff9e0 >> 0x20), (int)local_20c < 4;
      local_20c = local_20c + 1) {
    for (local_210 = 0; dVar14 = local_1f8, (int)local_210 < 4; local_210 = local_210 + 1) {
      pdVar4 = DynamicRectMatrix<double>::operator()(&local_208,local_20c,local_210);
      *pdVar4 = dVar14 * *pdVar4;
    }
  }
  JAMA::Eigenvalue<double>::Eigenvalue(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  DynamicRectMatrix<double>::DynamicRectMatrix
            ((DynamicRectMatrix<double> *)in_stack_fffffffffffff9b0._M_current,
             (uint)((ulong)in_stack_fffffffffffff9a8._M_current >> 0x20),
             (uint)in_stack_fffffffffffff9a8._M_current);
  std::allocator<double>::allocator((allocator<double> *)0x1333d2);
  DynamicVector<double,_std::allocator<double>_>::DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9a0,
             (size_type)in_stack_fffffffffffff998,(allocator_type *)0x1333ec);
  std::allocator<double>::~allocator((allocator<double> *)0x1333fb);
  JAMA::Eigenvalue<double>::getRealEigenvalues
            ((Eigenvalue<double> *)in_stack_fffffffffffff9b0._M_current,
             (DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9a8._M_current)
  ;
  JAMA::Eigenvalue<double>::getV
            ((Eigenvalue<double> *)in_stack_fffffffffffff9b0._M_current,
             (DynamicRectMatrix<double> *)in_stack_fffffffffffff9a8._M_current);
  DynamicRectMatrix<double>::getColumn(in_stack_fffffffffffff9e8,col_00);
  pvVar10 = DynamicVector<double,_std::allocator<double>_>::operator[]
                      ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9a0,
                       (size_type)in_stack_fffffffffffff998);
  local_348[3] = 1.0 / *pvVar10;
  for (local_20c = 0; dVar14 = local_348[3], (int)local_20c < 3; local_20c = local_20c + 1) {
    pvVar10 = DynamicVector<double,_std::allocator<double>_>::operator[]
                        ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9a0
                         ,(size_type)in_stack_fffffffffffff998);
    local_348[(int)local_20c] = dVar14 * *pvVar10;
  }
  Vector<double,_2U>::Vector(&local_358);
  pdVar4 = Vector<double,_2U>::operator[](&local_358,0);
  *pdVar4 = local_348[1] * -0.5;
  pdVar4 = Vector<double,_2U>::operator[](&local_358,1);
  *pdVar4 = local_348[2] * -0.5;
  pdVar4 = Vector<double,_2U>::operator[](&local_358,0);
  dVar14 = *pdVar4;
  pdVar4 = Vector<double,_2U>::operator[](&local_358,0);
  dVar2 = *pdVar4;
  pdVar4 = Vector<double,_2U>::operator[](&local_358,1);
  dVar17 = *pdVar4;
  pdVar4 = Vector<double,_2U>::operator[](&local_358,1);
  local_360 = sqrt(ABS((dVar14 * dVar2 + dVar17 * *pdVar4) - local_348[0]));
  for (local_364 = 0; local_364 < 100; local_364 = local_364 + 1) {
    Vector<double,_2U>::Vector
              ((Vector<double,_2U> *)in_stack_fffffffffffff9b0._M_current,
               (Vector<double,_2U> *)in_stack_fffffffffffff9a8._M_current);
    local_380 = 0.0;
    local_398 = 0.0;
    Vector<double,_2U>::Vector(&local_390,&local_398);
    for (local_1ec = 0; local_1ec < local_1d4; local_1ec = local_1ec + 1) {
      std::vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::
      operator[](&local_1a0,(long)local_1ec);
      OpenMD::operator-((Vector<double,_2U> *)in_stack_fffffffffffff9a8._M_current,
                        (Vector<double,_2U> *)in_stack_fffffffffffff9a0);
      in_stack_fffffffffffff9b0._M_current =
           (double *)Vector<double,_2U>::length((Vector<double,_2U> *)0x133792);
      local_3b0 = (SelectionManager *)in_stack_fffffffffffff9b0._M_current;
      if (1e-06 < (double)in_stack_fffffffffffff9b0._M_current) {
        local_380 = local_380 + (double)in_stack_fffffffffffff9b0._M_current;
        local_3b8 = 1.0 / (double)in_stack_fffffffffffff9b0._M_current;
        OpenMD::operator*((double)in_stack_fffffffffffff9a8._M_current,
                          (Vector<double,_2U> *)in_stack_fffffffffffff9a0);
        Vector<double,_2U>::operator-=
                  ((Vector<double,_2U> *)in_stack_fffffffffffff9a0,
                   (Vector<double,_2U> *)in_stack_fffffffffffff998);
      }
    }
    local_380 = local_380 * local_1f8;
    Vector<double,_2U>::operator*=
              ((Vector<double,_2U> *)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
    OpenMD::operator*((double)in_stack_fffffffffffff9a8._M_current,
                      (Vector<double,_2U> *)in_stack_fffffffffffff9a0);
    OpenMD::operator+((Vector<double,_2U> *)in_stack_fffffffffffff9a8._M_current,
                      (Vector<double,_2U> *)in_stack_fffffffffffff9a0);
    Vector<double,_2U>::operator=
              ((Vector<double,_2U> *)in_stack_fffffffffffff9a8._M_current,
               (Vector<double,_2U> *)in_stack_fffffffffffff9a0);
    local_360 = local_380;
    OpenMD::operator-((Vector<double,_2U> *)in_stack_fffffffffffff9a8._M_current,
                      (Vector<double,_2U> *)in_stack_fffffffffffff9a0);
    in_stack_fffffffffffff9a8._M_current = Vector<double,_2U>::operator[](local_3f8,0);
    if ((ABS((double)((StuntDouble *)in_stack_fffffffffffff9a8._M_current)->_vptr_StuntDouble) <=
         1e-06) &&
       (in_stack_fffffffffffff9a0 =
             (Eigenvalue<double> *)Vector<double,_2U>::operator[](local_3f8,1),
       ABS(*(double *)in_stack_fffffffffffff9a0) <= 1e-06)) break;
  }
  pdVar4 = Vector<double,_2U>::operator[](&local_358,1);
  if (ABS(*pdVar4) <= local_360) {
    asin(*pdVar4 / local_360);
  }
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9b0._M_current,
             in_stack_fffffffffffff9a8._M_current);
  DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x133a69);
  DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x133a76);
  DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x133a83);
  JAMA::Eigenvalue<double>::~Eigenvalue(in_stack_fffffffffffff9a0);
  DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x133a9d);
  std::vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::~vector
            ((vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_> *)
             in_stack_fffffffffffff9b0._M_current);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffff9b0._M_current);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x133ac4);
  return;
}

Assistant:

void ContactAngle2::doFrame(int) {
    StuntDouble* sd;
    int i;

    // set up the bins for density analysis

    Mat3x3d hmat = info_->getSnapshotManager()->getCurrentSnapshot()->getHmat();
    RealType len = std::min(hmat(0, 0), hmat(1, 1));
    RealType zLen = hmat(2, 2);

    RealType dr = len / (RealType)nRBins_;
    RealType dz = zLen / (RealType)nZBins_;

    std::vector<std::vector<RealType>> histo;
    histo.resize(nRBins_);
    for (unsigned int i = 0; i < histo.size(); ++i) {
      histo[i].resize(nZBins_);
      std::fill(histo[i].begin(), histo[i].end(), 0.0);
    }

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    Vector3d com(centroidX_, centroidY_, solidZ_);

    // now that we have the centroid, we can make cylindrical density maps
    Vector3d pos;
    RealType r;
    RealType z;

    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      pos = sd->getPos() - com;

      // r goes from zero upwards
      r = sqrt(pow(pos.x(), 2) + pow(pos.y(), 2));
      // z is possibly symmetric around 0
      z = pos.z();

      int whichRBin = int(r / dr);
      int whichZBin = int((zLen / 2.0 + z) / dz);

      if ((whichRBin < int(nRBins_)) && (whichZBin >= 0) &&
          (whichZBin < int(nZBins_))) {
        histo[whichRBin][whichZBin] += sd->getMass();
      }
    }

    for (unsigned int i = 0; i < histo.size(); ++i) {
      RealType rL       = i * dr;
      RealType rU       = rL + dr;
      RealType volSlice = Constants::PI * dz * ((rU * rU) - (rL * rL));

      for (unsigned int j = 0; j < histo[i].size(); ++j) {
        histo[i][j] *= Constants::densityConvert / volSlice;
      }
    }

    std::vector<Vector<RealType, 2>> points;
    points.clear();

    for (unsigned int j = 0; j < nZBins_; ++j) {
      // The z coordinates were measured relative to the selection
      // center of mass.  However, we're interested in the elevation
      // above the solid surface.  Also, the binning was done around
      // zero with enough bins to cover the zLength of the box:

      RealType thez    = com.z() - solidZ_ - zLen / 2.0 + dz * (j + 0.5);
      bool aboveThresh = false;
      bool foundThresh = false;
      int rloc         = 0;

      for (std::size_t i = 0; i < nRBins_; ++i) {
        if (histo[i][j] >= threshDens_) aboveThresh = true;

        if (aboveThresh && (histo[i][j] <= threshDens_)) {
          rloc        = i;
          foundThresh = true;
          aboveThresh = false;
        }
      }
      if (foundThresh) {
        Vector<RealType, 2> point;
        point[0] = dr * (rloc + 0.5);
        point[1] = thez;

        if (thez > bufferLength_) { points.push_back(point); }
      }
    }

    int numPoints = points.size();

    // Compute the average of the data points.
    Vector<RealType, 2> average = points[0];
    int i0;
    for (i0 = 1; i0 < numPoints; ++i0) {
      average += points[i0];
    }
    RealType invNumPoints = ((RealType)1) / (RealType)numPoints;
    average *= invNumPoints;

    DynamicRectMatrix<RealType> mat(4, 4);
    int row, col;
    for (row = 0; row < 4; ++row) {
      for (col = 0; col < 4; ++col) {
        mat(row, col) = 0.0;
      }
    }
    for (int i = 0; i < numPoints; ++i) {
      RealType x   = points[i][0];
      RealType y   = points[i][1];
      RealType x2  = x * x;
      RealType y2  = y * y;
      RealType xy  = x * y;
      RealType r2  = x2 + y2;
      RealType xr2 = x * r2;
      RealType yr2 = y * r2;
      RealType r4  = r2 * r2;

      mat(0, 1) += x;
      mat(0, 2) += y;
      mat(0, 3) += r2;
      mat(1, 1) += x2;
      mat(1, 2) += xy;
      mat(1, 3) += xr2;
      mat(2, 2) += y2;
      mat(2, 3) += yr2;
      mat(3, 3) += r4;
    }
    mat(0, 0) = (RealType)numPoints;

    for (row = 0; row < 4; ++row) {
      for (col = 0; col < row; ++col) {
        mat(row, col) = mat(col, row);
      }
    }

    for (row = 0; row < 4; ++row) {
      for (col = 0; col < 4; ++col) {
        mat(row, col) *= invNumPoints;
      }
    }

    JAMA::Eigenvalue<RealType> eigensystem(mat);
    DynamicRectMatrix<RealType> evects(4, 4);
    DynamicVector<RealType> evals(4);

    eigensystem.getRealEigenvalues(evals);
    eigensystem.getV(evects);

    DynamicVector<RealType> evector = evects.getColumn(0);
    RealType inv = ((RealType)1) / evector[3];  // beware zero divide
    RealType coeff[3];
    for (row = 0; row < 3; ++row) {
      coeff[row] = inv * evector[row];
    }

    Vector<RealType, 2> center;

    center[0] = -((RealType)0.5) * coeff[1];
    center[1] = -((RealType)0.5) * coeff[2];
    RealType radius =
        sqrt(fabs(center[0] * center[0] + center[1] * center[1] - coeff[0]));

    int i1;
    for (i1 = 0; i1 < 100; ++i1) {
      // Update the iterates.
      Vector<RealType, 2> current = center;

      // Compute average L, dL/da, dL/db.
      RealType lenAverage               = (RealType)0;
      Vector<RealType, 2> derLenAverage = Vector<RealType, 2>(0.0);
      for (i0 = 0; i0 < numPoints; ++i0) {
        Vector<RealType, 2> diff = points[i0] - center;
        RealType length          = diff.length();
        if (length > 1e-6) {
          lenAverage += length;
          RealType invLength = ((RealType)1) / length;
          derLenAverage -= invLength * diff;
        }
      }
      lenAverage *= invNumPoints;
      derLenAverage *= invNumPoints;

      center = average + lenAverage * derLenAverage;
      radius = lenAverage;

      Vector<RealType, 2> diff = center - current;
      if (fabs(diff[0]) <= 1e-6 && fabs(diff[1]) <= 1e-6) { break; }
    }

    RealType zCen  = center[1];
    RealType rDrop = radius;
    RealType ca;

    if (fabs(zCen) > rDrop) {
      ca = 180.0;
    } else {
      ca = 90.0 + asin(zCen / rDrop) * (180.0 / Constants::PI);
    }

    values_.push_back(ca);
  }